

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_generator_testing.h
# Opt level: O2

pair<const_int,_phmap::priv::NonStandardLayout> * __thiscall
phmap::priv::hash_internal::Generator<std::pair<const_int,_phmap::priv::NonStandardLayout>,_void>::
operator()(pair<const_int,_phmap::priv::NonStandardLayout> *__return_storage_ptr__,
          Generator<std::pair<const_int,_phmap::priv::NonStandardLayout>,_void> *this)

{
  int iVar1;
  Generator<phmap::priv::NonStandardLayout,_void> local_42;
  Generator<int,_void> local_41;
  NonStandardLayout local_40;
  
  iVar1 = Generator<int,_void>::operator()(&local_41);
  Generator<phmap::priv::NonStandardLayout,_void>::operator()(&local_40,&local_42);
  __return_storage_ptr__->first = iVar1;
  NonStandardLayout::NonStandardLayout(&__return_storage_ptr__->second,&local_40);
  NonStandardLayout::~NonStandardLayout(&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::pair<K, V> operator()() const {
        return std::pair<K, V>(Generator<typename std::decay<K>::type>()(),
                               Generator<typename std::decay<V>::type>()());
    }